

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

void __thiscall ot::commissioner::coap::Coap::CancelRequests(Coap *this)

{
  RequestHolder *pRVar1;
  char *begin;
  char *pcVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  undefined1 local_c8 [8];
  _Alloc_hider _Stack_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  code *local_a0;
  undefined1 local_98 [40];
  string uri;
  string local_50;
  
  do {
    if ((this->mRequestsCache).mContainer._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
      return;
    }
    std::__cxx11::string::string((string *)&uri,"UNKNOWN_URI",(allocator *)local_c8);
    pRVar1 = RequestsCache::Front(&this->mRequestsCache);
    Message::GetUriPath((Error *)local_c8,
                        (pRVar1->mRequest).
                        super___shared_ptr<ot::commissioner::coap::Message,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr,&uri);
    std::__cxx11::string::~string((string *)&_Stack_c0);
    pRVar1 = RequestsCache::Front(&this->mRequestsCache);
    local_c8._0_4_ = string_type;
    _Stack_c0._M_p = "request to {} was cancelled";
    local_b8 = 0x1b;
    local_b0._M_allocated_capacity = 0x100000000;
    local_a0 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    pcVar2 = "request to {} was cancelled";
    local_b0._8_8_ = local_c8;
    while (begin = pcVar2, begin != "") {
      pcVar2 = begin + 1;
      if (*begin == '}') {
        if ((pcVar2 == "") || (*pcVar2 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar2 = begin + 2;
      }
      else if (*begin == '{') {
        pcVar2 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                           (begin,"",(format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_c8);
      }
    }
    local_c8 = (undefined1  [8])uri._M_dataplus._M_p;
    _Stack_c0._M_p = (pointer)uri._M_string_length;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_c8;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x1b;
    ::fmt::v10::vformat_abi_cxx11_(&local_50,(v10 *)"request to {} was cancelled",fmt,args);
    local_98._0_4_ = kCancelled;
    std::__cxx11::string::string((string *)(local_98 + 8),(string *)&local_50);
    FinalizeTransaction(this,pRVar1,(Response *)0x0,(Error *)local_98);
    std::__cxx11::string::~string((string *)(local_98 + 8));
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&uri);
  } while( true );
}

Assistant:

void Coap::CancelRequests()
{
    while (!mRequestsCache.IsEmpty())
    {
        std::string uri = "UNKNOWN_URI";
        mRequestsCache.Front().mRequest->GetUriPath(uri).IgnoreError();
        FinalizeTransaction(mRequestsCache.Front(), nullptr, ERROR_CANCELLED("request to {} was cancelled", uri));
    }
}